

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roll-parser.cpp
# Opt level: O0

parse_node * __thiscall
ORPG::ExpressionTree::new_number(ExpressionTree *this,parse_node *curr,int *numBytesToRead)

{
  int iVar1;
  parse_node *ppVar2;
  long lVar3;
  long lVar4;
  int local_58 [2];
  int numBytesRead;
  allocator local_41;
  string local_40 [8];
  string currParseString;
  int *numBytesToRead_local;
  parse_node *curr_local;
  ExpressionTree *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_58[0] = 0;
  parse_input_string(this,(string *)local_40,local_58,*numBytesToRead);
  if (curr->left == (parse_node *)0x0) {
    ppVar2 = allocate_node(this);
    curr->left = ppVar2;
    curr->left->parent = curr;
    numBytesToRead_local = (int *)curr->left;
  }
  else {
    numBytesToRead_local = (int *)curr;
    if (curr->right == (parse_node *)0x0) {
      ppVar2 = allocate_node(this);
      curr->right = ppVar2;
      curr->right->parent = curr;
      numBytesToRead_local = (int *)curr->right;
    }
  }
  iVar1 = std::__cxx11::stoi((string *)local_40,(size_t *)0x0,10);
  numBytesToRead_local[7] = iVar1;
  *(undefined2 *)(numBytesToRead_local + 6) = 1;
  if ((*(long *)(numBytesToRead_local + 4) == 0) &&
     (lVar3 = (long)local_58[0], lVar4 = std::__cxx11::string::length(), lVar3 != lVar4)) {
    ppVar2 = allocate_node(this);
    *(parse_node **)(numBytesToRead_local + 4) = ppVar2;
    **(undefined8 **)(numBytesToRead_local + 4) = numBytesToRead_local;
  }
  ppVar2 = *(parse_node **)(numBytesToRead_local + 4);
  *numBytesToRead = 0;
  std::__cxx11::string::~string(local_40);
  return ppVar2;
}

Assistant:

struct parse_node* ExpressionTree::new_number(struct parse_node* curr, int
                            * numBytesToRead) {
        string currParseString = "";
        int numBytesRead = 0;

        parse_input_string(&currParseString, &numBytesRead, *numBytesToRead);

        if(!curr->left) {
            curr->left = allocate_node();
            curr->left->parent = curr;
            curr = curr->left;
        } else if(!curr->right) {
            curr->right = allocate_node();
            curr->right->parent = curr;
            curr = curr->right;
        }
                
        curr->value = stoi(currParseString);
        curr->op = OP_NUMBER;


        if(curr->parent == NULL && (size_t)numBytesRead != inputString.length()) {
            curr->parent = allocate_node();
            curr->parent->left = curr;
        }
            
        curr = curr->parent;

        *numBytesToRead = 0;
        
        return curr;
    }